

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmfilelockmgr.cpp
# Opt level: O2

PAL_ERROR FILEUnlockFileRegion
                    (SHMPTR shmFileLocks,PVOID pvControllerInstance,UINT64 unlockRgnStart,
                    UINT64 nbBytesToUnlock,LOCK_TYPE unlockType)

{
  DWORD DVar1;
  LPVOID pvVar2;
  DWORD *pDVar3;
  SHMPTR *pSVar4;
  PAL_ERROR PVar5;
  SHMPTR shmptr;
  DWORD *pDVar6;
  
  SHMLock();
  if (nbBytesToUnlock == 0) {
LAB_00128f69:
    PVar5 = 0x9e;
    if (PAL_InitializeChakraCoreCalled == false) {
LAB_00128fbb:
      abort();
    }
    goto LAB_00128f7a;
  }
  if (shmFileLocks != 0) {
    pvVar2 = SHMPtrToPtr(shmFileLocks);
    if (pvVar2 != (LPVOID)0x0) {
      if (*(SHMPTR *)((long)pvVar2 + 8) == 0) {
        pDVar3 = (DWORD *)0x0;
      }
      else {
        pDVar3 = (DWORD *)SHMPtrToPtr(*(SHMPTR *)((long)pvVar2 + 8));
        if (pDVar3 == (DWORD *)0x0) goto LAB_00128e66;
      }
      DVar1 = GetCurrentProcessId();
      shmptr = *(SHMPTR *)((long)pvVar2 + 8);
      pDVar6 = (DWORD *)0x0;
      do {
        do {
          if (pDVar3 == (DWORD *)0x0) goto LAB_00128f69;
          if ((((*pDVar3 == DVar1) && (*(PVOID *)(pDVar3 + 2) == pvControllerInstance)) &&
              (*(UINT64 *)(pDVar3 + 4) == unlockRgnStart)) &&
             ((*(UINT64 *)(pDVar3 + 6) == nbBytesToUnlock && (pDVar3[8] == unlockType)))) {
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_00128fbb;
            pSVar4 = (SHMPTR *)(pDVar6 + 10);
            if (pDVar6 == (DWORD *)0x0) {
              pSVar4 = (SHMPTR *)((long)pvVar2 + 8);
            }
            *pSVar4 = *(SHMPTR *)(pDVar3 + 10);
            SHMfree(shmptr);
            PVar5 = 0;
            goto LAB_00128f7a;
          }
          shmptr = *(SHMPTR *)(pDVar3 + 10);
          pDVar6 = pDVar3;
          pDVar3 = (DWORD *)0x0;
        } while (shmptr == 0);
        pDVar3 = (DWORD *)SHMPtrToPtr(shmptr);
      } while (pDVar3 != (DWORD *)0x0);
      PVar5 = 0;
      fprintf(_stderr,"] %s %s:%d","FILEUnlockFileRegion",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/shmfilelockmgr.cpp"
              ,0x28c);
      fprintf(_stderr,"Unable to get pointer from shm pointer.\n");
      goto LAB_00128f7a;
    }
  }
LAB_00128e66:
  fprintf(_stderr,"] %s %s:%d","FILEUnlockFileRegion",
          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/shmfilelockmgr.cpp"
          ,0x279);
  fprintf(_stderr,"Unable to get pointer from shm pointer.\n");
  PVar5 = 0x54f;
LAB_00128f7a:
  SHMRelease();
  return PVar5;
}

Assistant:

PAL_ERROR
FILEUnlockFileRegion(
    SHMPTR shmFileLocks,
    PVOID pvControllerInstance,
    UINT64 unlockRgnStart, 
    UINT64 nbBytesToUnlock,
    LOCK_TYPE unlockType
    )
{
    PAL_ERROR palError = NO_ERROR;
    SHMFILELOCKRGNS *prevLock = NULL, *curLockRgn = NULL, unlockRgn;
    SHMPTR shmcurLockRgn;
    SHMFILELOCKS *fileLocks;

    SHMLock();

    
    /* check if the region to unlock is empty or not */
    if (nbBytesToUnlock == 0) 
    {
        palError = ERROR_NOT_LOCKED;
        WARN("Attempt to unlock an empty region\n");
        goto EXIT;
    }
    
    if ((SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKS, fileLocks, shmFileLocks) == FALSE) || 
        (fileLocks == NULL) ||
        (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKRGNS, curLockRgn, fileLocks->fileLockedRgns) == FALSE))
    {
        ASSERT("Unable to get pointer from shm pointer.\n");
        palError = ERROR_INTERNAL_ERROR;
        goto EXIT;
    }
    
    unlockRgn.processId = GetCurrentProcessId();
    unlockRgn.pvControllerInstance = pvControllerInstance;
    unlockRgn.lockRgnStart = unlockRgnStart;
    unlockRgn.nbBytesLocked = nbBytesToUnlock;
    unlockRgn.lockType = unlockType;

    shmcurLockRgn = fileLocks->fileLockedRgns;
    
    while((curLockRgn != NULL) && !IS_LOCK_EQUAL(curLockRgn, &unlockRgn))
    {
        prevLock = curLockRgn; 
        shmcurLockRgn = curLockRgn->next;
        if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKRGNS, curLockRgn, shmcurLockRgn) == FALSE)
        {
            ASSERT("Unable to get pointer from shm pointer.\n");
            goto EXIT;
        }
    }
    
    if (curLockRgn != NULL) 
    {
        TRACE("removing the lock region (%I64u, %I64u)\n", 
               curLockRgn->lockRgnStart, curLockRgn->nbBytesLocked);

        if (prevLock == NULL) 
        {
            /* removing the first lock */
            fileLocks->fileLockedRgns = curLockRgn->next;
        }
        else
        {
            prevLock->next = curLockRgn->next;
        }
        SHMfree(shmcurLockRgn);
    }
    else
    {
        /* the lock doesn't exist */
        WARN("Attempt to unlock a non locked region\n");
        palError = ERROR_NOT_LOCKED;
        goto EXIT;
    }
    
EXIT:    
    SHMRelease();
    return palError;
}